

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  float *pfVar5;
  void *pvVar6;
  int k;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  void *pvVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int j;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  int i_3;
  int iVar26;
  uint uVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  Mat top_blob_bordered;
  Mat out;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m;
  
  uVar22 = bottom_blob->w;
  uVar9 = (ulong)uVar22;
  uVar27 = bottom_blob->h;
  uVar10 = (ulong)uVar27;
  iVar3 = bottom_blob->c;
  iVar23 = this->kernel_w;
  iVar8 = this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  iVar26 = this->stride_w;
  iVar14 = this->kernel_h;
  iVar15 = this->dilation_h;
  iVar16 = this->stride_h;
  iVar19 = this->output_pad_right;
  iVar4 = this->output_pad_bottom;
  top_blob_bordered.cstep = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered._16_12_ = SUB1612((undefined1  [16])0x0,4);
  top_blob_bordered._32_12_ = SUB1612((undefined1  [16])0x0,0);
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.d = 0;
  top_blob_bordered.c = 0;
  auVar29._0_4_ = -(uint)(0 < this->pad_left);
  auVar29._4_4_ = -(uint)(0 < this->pad_right);
  auVar29._8_4_ = -(uint)(0 < this->pad_top);
  auVar29._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar13 = movmskps((int)opt,auVar29);
  lVar20 = 0x10;
  if ((iVar13 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
    Mat::operator=(&top_blob_bordered,top_blob);
    lVar20 = 8;
  }
  iVar26 = iVar19 + (iVar23 + -1) * iVar8 + (uVar22 - 1) * iVar26 + 1;
  iVar23 = iVar4 + 1 + (iVar14 + -1) * iVar15 + (uVar27 - 1) * iVar16;
  Mat::create(&top_blob_bordered,iVar26,iVar23,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar20));
  iVar8 = -100;
  if ((top_blob_bordered.data != (void *)0x0) &&
     ((long)top_blob_bordered.c * top_blob_bordered.cstep != 0)) {
    uVar7 = this->kernel_w * this->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar7,(allocator_type *)&out);
    iVar8 = this->dilation_h;
    iVar14 = this->kernel_w;
    iVar15 = this->dilation_w * iVar14;
    iVar19 = 0;
    lVar20 = 0;
    for (iVar16 = 0; iVar16 < this->kernel_h; iVar16 = iVar16 + 1) {
      for (lVar21 = 0; (int)lVar21 < iVar14; lVar21 = lVar21 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar20 + lVar21] = iVar19;
        iVar19 = iVar19 + this->dilation_w;
        iVar14 = this->kernel_w;
      }
      iVar19 = iVar19 + (iVar8 * iVar26 - iVar15);
      lVar20 = (int)lVar20 + lVar21;
    }
    uVar17 = 0;
    if (0 < (int)uVar7) {
      uVar17 = (ulong)uVar7;
    }
    iVar8 = 0;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
    if ((int)uVar22 < 1) {
      uVar9 = 0;
    }
    if ((int)uVar27 < 1) {
      uVar10 = 0;
    }
    uVar22 = iVar23 * iVar26;
    if ((int)uVar22 < 1) {
      uVar22 = 0;
    }
    uVar24 = (ulong)uVar22;
    iVar23 = 0;
    for (lVar20 = 0; lVar20 < this->num_output; lVar20 = lVar20 + 1) {
      Mat::channel(&out,&top_blob_bordered,(int)lVar20);
      if (this->bias_term == 0) {
        fVar28 = 0.0;
      }
      else {
        fVar28 = *(float *)((long)(this->bias_data).data + lVar20 * 4);
      }
      Mat::fill(&out,fVar28);
      for (uVar12 = 0; pvVar6 = out.data, uVar12 != uVar10; uVar12 = uVar12 + 1) {
        for (uVar25 = 0; pvVar6 = out.data, uVar25 != uVar9; uVar25 = uVar25 + 1) {
          lVar21 = (long)(int)uVar25 * (long)this->stride_w * 4 +
                   (long)out.w * (long)this->stride_h * (long)(int)uVar12 * out.elemsize;
          pvVar18 = (void *)((long)(this->weight_data).data + (long)iVar23 * 4);
          for (iVar26 = 0; iVar26 != iVar8; iVar26 = iVar26 + 1) {
            Mat::channel(&m,bottom_blob,iVar26);
            fVar28 = *(float *)((long)m.data + uVar25 * 4 + (long)m.w * uVar12 * m.elemsize);
            for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
              *(float *)((long)pvVar6 +
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar11] * 4 + lVar21) =
                   *(float *)((long)pvVar18 + uVar11 * 4) * fVar28 +
                   *(float *)((long)pvVar6 +
                             (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar11] * 4 + lVar21);
            }
            Mat::~Mat(&m);
            pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar7 * 4);
          }
        }
      }
      switch(this->activation_type) {
      case 1:
        for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
          fVar28 = *(float *)((long)out.data + uVar12 * 4);
          if (fVar28 <= 0.0) {
            fVar28 = 0.0;
          }
          *(float *)((long)out.data + uVar12 * 4) = fVar28;
        }
        break;
      case 2:
        uVar22 = *(this->activation_params).data;
        for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
          fVar28 = *(float *)((long)out.data + uVar12 * 4);
          uVar27 = -(uint)(0.0 < fVar28);
          *(float *)((long)out.data + uVar12 * 4) =
               (float)(~uVar27 & uVar22 | uVar27 & 0x3f800000) * fVar28;
        }
        break;
      case 3:
        pfVar5 = (float *)(this->activation_params).data;
        fVar28 = *pfVar5;
        fVar1 = pfVar5[1];
        for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
          fVar2 = *(float *)((long)out.data + uVar12 * 4);
          fVar30 = fVar2;
          if (fVar2 <= fVar28) {
            fVar30 = fVar28;
          }
          if ((fVar2 < fVar28) || (fVar1 < fVar30)) {
            if (fVar1 <= fVar30) {
              fVar30 = fVar1;
            }
            *(float *)((long)out.data + uVar12 * 4) = fVar30;
          }
        }
        break;
      case 4:
        for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
          fVar28 = expf(-*(float *)((long)pvVar6 + uVar12 * 4));
          *(float *)((long)pvVar6 + uVar12 * 4) = 1.0 / (fVar28 + 1.0);
        }
      }
      Mat::~Mat(&out);
      iVar23 = iVar23 + iVar3 * uVar7;
    }
    cut_padding(this,&top_blob_bordered,top_blob,opt);
    if ((top_blob->data == (void *)0x0) || (iVar8 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
      iVar8 = -100;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&top_blob_bordered);
  return iVar8;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}